

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.hpp
# Opt level: O0

void __thiscall helics::Translator::~Translator(Translator *this)

{
  Translator *in_RDI;
  
  ~Translator(in_RDI);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

Translator(Translator&& trans) = default;